

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalException.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::ApprovalMissingException::format
          (string *__return_storage_ptr__,ApprovalMissingException *this,string *file)

{
  ostream *poVar1;
  stringstream s;
  ostream local_188;
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&s);
  poVar1 = ::std::operator<<(&local_188,"Failed Approval: \n");
  poVar1 = ::std::operator<<(poVar1,"Approval File Not Found \n");
  poVar1 = ::std::operator<<(poVar1,"File: \"");
  poVar1 = ::std::operator<<(poVar1,(string *)file);
  ::std::operator<<(poVar1,'\"');
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string ApprovalMissingException::format(const std::string& file)
    {
        std::stringstream s;
        s << "Failed Approval: \n"
          << "Approval File Not Found \n"
          << "File: \"" << file << '"';
        return s.str();
    }